

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winingstate_test.cpp
# Opt level: O2

void __thiscall
TEST_WiningStateTest_LastTileFromTheWall_Test::TEST_WiningStateTest_LastTileFromTheWall_Test
          (TEST_WiningStateTest_LastTileFromTheWall_Test *this)

{
  memset(this,0,0xc0);
  TEST_GROUP_CppUTestGroupWiningStateTest::TEST_GROUP_CppUTestGroupWiningStateTest
            (&this->super_TEST_GROUP_CppUTestGroupWiningStateTest);
  (this->super_TEST_GROUP_CppUTestGroupWiningStateTest).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_GROUP_CppUTestGroupWiningStateTest_001de4e8;
  return;
}

Assistant:

TEST(WiningStateTest, LastTileFromTheWall)
{
	addNoWiningHand(true);

	SelfDrawnSituation situation;
	situation.is_last_wall = true;

	selfDrawn(situation);
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::LastTileFromTheWall));
	CHECK_EQUAL(1, r.doubling_factor);
}